

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

void __thiscall cdnsBlockTables::~cdnsBlockTables(cdnsBlockTables *this)

{
  std::_Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>::~_Vector_base
            (&(this->rrs).super__Vector_base<cdns_rr_field,_std::allocator<cdns_rr_field>_>);
  std::vector<cdns_rr_list,_std::allocator<cdns_rr_list>_>::~vector(&this->rr_list);
  std::_Vector_base<cdns_question,_std::allocator<cdns_question>_>::~_Vector_base
            (&(this->qrr).super__Vector_base<cdns_question,_std::allocator<cdns_question>_>);
  std::vector<cdns_question_list,_std::allocator<cdns_question_list>_>::~vector
            (&this->question_list);
  std::_Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>::~_Vector_base
            (&(this->q_sigs).
              super__Vector_base<cdns_query_signature,_std::allocator<cdns_query_signature>_>);
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::~vector(&this->name_rdata);
  std::_Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>::~_Vector_base
            (&(this->class_ids).super__Vector_base<cdns_class_id,_std::allocator<cdns_class_id>_>);
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::~vector(&this->addresses);
  return;
}

Assistant:

cdnsBlockTables::~cdnsBlockTables()
{
}